

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeepEquivalentUnitsInIntermediary_Test
::
~Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeepEquivalentUnitsInIntermediary_Test
          (Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeepEquivalentUnitsInIntermediary_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeepEquivalentUnitsInIntermediary)
{
    libcellml::ImporterPtr importer;
    libcellml::ModelPtr model;

    setupFlattenImportedUnits(importer, model, "int1");

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(2), flatModel->unitsCount());
    EXPECT_EQ("per_fmol", flatModel->units(0)->name());
    EXPECT_EQ("fmol", flatModel->units(1)->name());
}